

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O2

void duckdb::CSVCopyFunction::RegisterFunction(BuiltinFunctions *set)

{
  CopyFunction info;
  allocator local_721;
  CopyFunction local_720;
  TableFunction local_470;
  CopyFunction local_2b8;
  
  ::std::__cxx11::string::string((string *)&local_470,"csv",&local_721);
  CopyFunction::CopyFunction(&local_720,(string *)&local_470);
  ::std::__cxx11::string::~string((string *)&local_470);
  local_720.copy_to_bind = WriteCSVBind;
  local_720.copy_to_initialize_local = WriteCSVInitializeLocal;
  local_720.copy_to_initialize_global = WriteCSVInitializeGlobal;
  local_720.copy_to_sink = WriteCSVSink;
  local_720.copy_to_combine = WriteCSVCombine;
  local_720.copy_to_finalize = WriteCSVFinalize;
  local_720.execution_mode = WriteCSVExecutionMode;
  local_720.prepare_batch = WriteCSVPrepareBatch;
  local_720.flush_batch = WriteCSVFlushBatch;
  local_720.rotate_files = WriteCSVRotateFiles;
  local_720.rotate_next_file = WriteCSVRotateNextFile;
  local_720.copy_from_bind = MultiFileFunction<duckdb::CSVMultiFileInfo>::MultiFileBindCopy;
  ReadCSVTableFunction::GetFunction();
  TableFunction::operator=(&local_720.copy_from_function,&local_470);
  TableFunction::~TableFunction(&local_470);
  ::std::__cxx11::string::assign((char *)&local_720.extension);
  CopyFunction::CopyFunction(&local_2b8,&local_720);
  BuiltinFunctions::AddFunction(set,&local_2b8);
  CopyFunction::~CopyFunction(&local_2b8);
  CopyFunction::~CopyFunction(&local_720);
  return;
}

Assistant:

void CSVCopyFunction::RegisterFunction(BuiltinFunctions &set) {
	CopyFunction info("csv");
	info.copy_to_bind = WriteCSVBind;
	info.copy_to_initialize_local = WriteCSVInitializeLocal;
	info.copy_to_initialize_global = WriteCSVInitializeGlobal;
	info.copy_to_sink = WriteCSVSink;
	info.copy_to_combine = WriteCSVCombine;
	info.copy_to_finalize = WriteCSVFinalize;
	info.execution_mode = WriteCSVExecutionMode;
	info.prepare_batch = WriteCSVPrepareBatch;
	info.flush_batch = WriteCSVFlushBatch;
	info.rotate_files = WriteCSVRotateFiles;
	info.rotate_next_file = WriteCSVRotateNextFile;

	info.copy_from_bind = MultiFileFunction<CSVMultiFileInfo>::MultiFileBindCopy;
	info.copy_from_function = ReadCSVTableFunction::GetFunction();

	info.extension = "csv";

	set.AddFunction(info);
}